

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O3

void __thiscall
Lib::
MaybeAlive<Lib::Stack<std::unique_ptr<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>_>_>
::~MaybeAlive(MaybeAlive<Lib::Stack<std::unique_ptr<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>_>_>
              *this)

{
  DHMap<Kernel::VarSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *this_00;
  ulong uVar1;
  unique_ptr<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  *puVar2;
  void **head;
  unique_ptr<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  *puVar3;
  
  *this->_alive = false;
  puVar2 = (this->_self)._stack;
  puVar3 = (this->_self)._cursor;
  if (puVar3 != puVar2) {
    do {
      this_00 = &(puVar3[-1]._M_t.
                  super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                  .
                  super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
                 ._M_head_impl)->_map;
      if (this_00 !=
          (DHMap<Kernel::VarSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0) {
        DHMap<Kernel::VarSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                  (this_00);
        this_00->_timestamp = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
        this_00->_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = this_00;
      }
      puVar3 = puVar3 + -1;
      (puVar3->_M_t).
      super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      .
      super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
      ._M_head_impl = (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0;
      puVar2 = (this->_self)._stack;
    } while (puVar3 != puVar2);
  }
  if (puVar2 != (unique_ptr<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                 *)0x0) {
    uVar1 = (this->_self)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar1 == 0) {
      (puVar2->_M_t).
      super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      .
      super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
      ._M_head_impl =
           (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)
           GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = puVar2;
    }
    else if (uVar1 < 0x11) {
      (puVar2->_M_t).
      super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      .
      super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
      ._M_head_impl =
           (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)
           GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = puVar2;
    }
    else if (uVar1 < 0x19) {
      (puVar2->_M_t).
      super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      .
      super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
      ._M_head_impl =
           (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)
           GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = puVar2;
    }
    else if (uVar1 < 0x21) {
      (puVar2->_M_t).
      super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      .
      super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
      ._M_head_impl =
           (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)
           GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = puVar2;
    }
    else if (uVar1 < 0x31) {
      (puVar2->_M_t).
      super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      .
      super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
      ._M_head_impl =
           (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)
           GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = puVar2;
    }
    else {
      if (0x40 < uVar1) {
        operator_delete(puVar2,0x10);
        return;
      }
      (puVar2->_M_t).
      super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      .
      super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
      ._M_head_impl =
           (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)
           GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = puVar2;
    }
  }
  return;
}

Assistant:

~MaybeAlive() { *_alive = false; }